

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

int MuxImageFinalize(WebPMuxImage *wpi)

{
  WebPChunk *pWVar1;
  uint8_t *data;
  size_t data_size;
  int iVar2;
  uint uVar3;
  int vp8l_has_alpha;
  int h;
  int w;
  
  pWVar1 = wpi->img_;
  vp8l_has_alpha = 0;
  data = (pWVar1->data_).bytes;
  data_size = (pWVar1->data_).size;
  if (pWVar1->tag_ == 0x4c385056) {
    iVar2 = VP8LGetInfo(data,data_size,&w,&h,&vp8l_has_alpha);
    if (iVar2 == 0) {
      return 0;
    }
    if (wpi->alpha_ != (WebPChunk *)0x0) {
      ChunkDelete(wpi->alpha_);
      wpi->alpha_ = (WebPChunk *)0x0;
    }
  }
  else {
    iVar2 = VP8GetInfo(data,data_size,data_size,&w,&h);
    if (iVar2 == 0) {
      return 0;
    }
  }
  wpi->width_ = w;
  wpi->height_ = h;
  if (vp8l_has_alpha == 0) {
    uVar3 = (uint)(wpi->alpha_ != (WebPChunk *)0x0);
  }
  else {
    uVar3 = 1;
  }
  wpi->has_alpha_ = uVar3;
  return iVar2;
}

Assistant:

int MuxImageFinalize(WebPMuxImage* const wpi) {
  const WebPChunk* const img = wpi->img_;
  const WebPData* const image = &img->data_;
  const int is_lossless = (img->tag_ == kChunks[IDX_VP8L].tag);
  int w, h;
  int vp8l_has_alpha = 0;
  const int ok = is_lossless ?
      VP8LGetInfo(image->bytes, image->size, &w, &h, &vp8l_has_alpha) :
      VP8GetInfo(image->bytes, image->size, image->size, &w, &h);
  assert(img != NULL);
  if (ok) {
    // Ignore ALPH chunk accompanying VP8L.
    if (is_lossless && (wpi->alpha_ != NULL)) {
      ChunkDelete(wpi->alpha_);
      wpi->alpha_ = NULL;
    }
    wpi->width_ = w;
    wpi->height_ = h;
    wpi->has_alpha_ = vp8l_has_alpha || (wpi->alpha_ != NULL);
  }
  return ok;
}